

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O1

void __thiscall avro::detail::Chunk::Chunk(Chunk *this,size_type size)

{
  char *pcVar1;
  
  (this->callOnDestroy_).px = (element_type *)0x0;
  (this->callOnDestroy_).pn.pi_ = (sp_counted_base *)0x0;
  pcVar1 = (char *)operator_new__(size);
  (this->underlyingBlock_).px = pcVar1;
  boost::detail::shared_count::shared_count<char*,boost::checked_array_deleter<char>>
            (&(this->underlyingBlock_).pn,pcVar1);
  pcVar1 = (this->underlyingBlock_).px;
  this->readPos_ = pcVar1;
  this->writePos_ = pcVar1;
  this->endPos_ = pcVar1 + size;
  return;
}

Assistant:

Chunk(size_type size) :
        underlyingBlock_(new data_type[size]), 
        readPos_(underlyingBlock_.get()),
        writePos_(readPos_),
        endPos_(readPos_ + size)
    { }